

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::IntStateGatherAcceleration
          (ChParticleCloud *this,uint off_a,ChStateDelta *a)

{
  ChAparticle *this_00;
  double *pdVar1;
  long lVar2;
  pointer ppCVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  double local_48 [3];
  
  ppCVar3 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    pdVar1 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar2 = (a->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uVar9 = 0;
    uVar5 = off_a + 3;
    uVar8 = (ulong)off_a;
    do {
      uVar10 = off_a + (int)uVar9 * 6;
      if (lVar2 + -3 < (long)(ulong)uVar10) goto LAB_005311b3;
      this_00 = ppCVar3[uVar9];
      uVar4 = 3;
      if (((ulong)(pdVar1 + uVar10) & 7) == 0) {
        uVar6 = -((uint)((ulong)(pdVar1 + uVar10) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar6 < 3) {
          uVar4 = (ulong)uVar6;
        }
        if (uVar6 != 0) goto LAB_005310bc;
      }
      else {
LAB_005310bc:
        uVar7 = 0;
        do {
          pdVar1[uVar8 + uVar7] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.coord_dtdt.pos.m_data
               [uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      if (uVar4 < 3) {
        do {
          pdVar1[uVar8 + uVar4] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.coord_dtdt.pos.m_data
               [uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      ChFrameMoving<double>::GetWacc_loc((ChFrameMoving<double> *)this_00);
      lVar2 = (a->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (lVar2 + -3 < (long)(ulong)(uVar10 + 3)) {
LAB_005311b3:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar4 = 3;
      if (((ulong)(pdVar1 + (uVar10 + 3)) & 7) == 0) {
        uVar10 = -((uint)((ulong)(pdVar1 + (uVar10 + 3)) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar10 < 3) {
          uVar4 = (ulong)uVar10;
        }
        if (uVar10 != 0) goto LAB_00531146;
      }
      else {
LAB_00531146:
        uVar7 = 0;
        do {
          pdVar1[uVar5 + uVar7] = local_48[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      if (uVar4 < 3) {
        do {
          pdVar1[uVar5 + uVar4] = local_48[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      ppCVar3 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar8 = (ulong)((int)uVar8 + 6);
      uVar5 = uVar5 + 6;
    } while (uVar9 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGatherAcceleration(const unsigned int off_a, ChStateDelta& a) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        a.segment(off_a + 6 * j + 0, 3) = particles[j]->coord_dtdt.pos.eigen();
        a.segment(off_a + 6 * j + 3, 3) = particles[j]->GetWacc_loc().eigen();
    }
}